

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O2

string * __thiscall re2::Regexp::ToString_abi_cxx11_(string *__return_storage_ptr__,Regexp *this)

{
  ToStringWalker w;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ToStringWalker::ToStringWalker(&w,__return_storage_ptr__);
  Walker<int>::WalkExponential(&w.super_Walker<int>,this,6,100000);
  if (w.super_Walker<int>.stopped_early_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  Walker<int>::~Walker(&w.super_Walker<int>);
  return __return_storage_ptr__;
}

Assistant:

std::string Regexp::ToString() {
  std::string t;
  ToStringWalker w(&t);
  w.WalkExponential(this, PrecToplevel, 100000);
  if (w.stopped_early())
    t += " [truncated]";
  return t;
}